

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<RCCFileInfo::DeduplicationKey,RCCFileInfo*>::emplace<RCCFileInfo*const&>
          (iterator *__return_storage_ptr__,void *this,DeduplicationKey *key,RCCFileInfo **args)

{
  long in_FS_OFFSET;
  DeduplicationKey local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  RCCFileInfo::DeduplicationKey::DeduplicationKey(&local_50,key);
  emplace<RCCFileInfo*const&>(__return_storage_ptr__,this,&local_50,args);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50.hash.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        return emplace(Key(key), std::forward<Args>(args)...);
    }